

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t pmxevtyper_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  byte bVar2;
  uint64_t *puVar3;
  
  uVar1 = (env->cp15).c9_pmselr;
  bVar2 = (byte)uVar1 & 0x1f;
  if (bVar2 == 0x1f) {
    puVar3 = &(env->cp15).pmccfiltr_el0;
  }
  else {
    if (((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f) <= (uint)bVar2) {
      return 0;
    }
    puVar3 = (env->cp15).c14_pmevtyper + ((uint)uVar1 & 0x1f);
  }
  return *puVar3;
}

Assistant:

static uint64_t pmxevtyper_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    return pmevtyper_read(env, ri, env->cp15.c9_pmselr & 31);
}